

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_standard_types.cpp
# Opt level: O0

void __thiscall
StringWriter_WriteThreeByteLengthCharString_Test::TestBody
          (StringWriter_WriteThreeByteLengthCharString_Test *this)

{
  allocator<unsigned_char> *paVar1;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __first;
  bool bVar2;
  long lVar3;
  char *pcVar4;
  reference puVar5;
  iterator __last;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *rhs;
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *matcher;
  AssertHelper local_220;
  Message local_218;
  size_t local_210;
  size_type local_208;
  undefined1 local_200 [8];
  AssertionResult gtest_ar_6;
  Message local_1e8;
  size_t local_1e0;
  size_type local_1d8;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar_5;
  Message local_1b8;
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_1b0;
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  local_198;
  undefined1 local_180 [8];
  AssertionResult gtest_ar_4;
  undefined1 local_168 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> expected_body;
  undefined1 local_138 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> body;
  Message local_118;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_110;
  int local_104;
  undefined1 local_100 [8];
  AssertionResult gtest_ar_3;
  Message local_e8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_e0;
  int local_d4;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar_2;
  Message local_b8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_b0;
  int local_a4;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar_1;
  iterator first;
  Message local_80;
  size_type local_78;
  unsigned_long local_70;
  undefined1 local_68 [8];
  AssertionResult gtest_ar;
  allocator local_41;
  undefined1 local_40 [8];
  string str;
  char src_char;
  size_type src_length;
  StringWriter_WriteThreeByteLengthCharString_Test *this_local;
  
  str.field_2._M_local_buf[0xf] = 'a';
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_40,0x4000,'a',&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  pstore::serialize::write<pstore::serialize::archive::vector_writer&,std::__cxx11::string>
            (&(this->super_StringWriter).writer_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
  lVar3 = std::__cxx11::string::length();
  local_70 = lVar3 + 3;
  local_78 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                       (&(this->super_StringWriter).bytes_);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_68,"str.length () + 3","bytes_.size ()",&local_70,&local_78);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar2) {
    testing::Message::Message(&local_80);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&first,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_standard_types.cpp"
               ,0x57,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&first,&local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&first);
    testing::Message::~Message(&local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )std::begin<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   (&(this->super_StringWriter).bytes_);
  local_a4 = 4;
  local_b0 = __gnu_cxx::
             __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator++((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           *)&gtest_ar_1.message_,0);
  puVar5 = __gnu_cxx::
           __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::operator*(&local_b0);
  testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
            ((EqHelper *)local_a0,"0b00000100","*(first++)",&local_a4,puVar5);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
  if (!bVar2) {
    testing::Message::Message(&local_b8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_standard_types.cpp"
               ,0x59,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
  local_d4 = 0;
  local_e0 = __gnu_cxx::
             __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator++((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           *)&gtest_ar_1.message_,0);
  puVar5 = __gnu_cxx::
           __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::operator*(&local_e0);
  testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
            ((EqHelper *)local_d0,"0b00000000","*(first++)",&local_d4,puVar5);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar2) {
    testing::Message::Message(&local_e8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_standard_types.cpp"
               ,0x5a,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  local_104 = 2;
  local_110 = __gnu_cxx::
              __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::operator++((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)&gtest_ar_1.message_,0);
  puVar5 = __gnu_cxx::
           __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::operator*(&local_110);
  testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
            ((EqHelper *)local_100,"0b00000010","*(first++)",&local_104,puVar5);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar2) {
    testing::Message::Message(&local_118);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &body.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_standard_types.cpp"
               ,0x5b,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &body.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_118);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &body.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  __first = gtest_ar_1.message_;
  __last = std::end<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                     (&(this->super_StringWriter).bytes_);
  paVar1 = (allocator<unsigned_char> *)
           ((long)&expected_body.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_char>::allocator(paVar1);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_138,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )__first._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )__last._M_current,paVar1);
  std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)
             ((long)&expected_body.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  gtest_ar_4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._7_1_ = 0x61;
  paVar1 = (allocator<unsigned_char> *)
           ((long)&gtest_ar_4.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           + 6);
  std::allocator<unsigned_char>::allocator(paVar1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_168,0x4000,
             (value_type *)
             ((long)&gtest_ar_4.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7),paVar1);
  std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)
             ((long)&gtest_ar_4.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 6));
  testing::ContainerEq<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            (&local_1b0,(testing *)local_168,rhs);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
            (&local_198,(internal *)&local_1b0,matcher);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
  ::operator()(local_180,(char *)&local_198,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1d5308);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::~PredicateFormatterFromMatcher(&local_198);
  testing::
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~PolymorphicMatcher(&local_1b0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
  if (!bVar2) {
    testing::Message::Message(&local_1b8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_180);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_standard_types.cpp"
               ,0x5f,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_1b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_1b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
  local_1d8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        (&(this->super_StringWriter).bytes_);
  local_1e0 = pstore::serialize::archive::
              writer_base<pstore::serialize::archive::details::vector_writer_policy>::bytes_consumed
                        (&(this->super_StringWriter).writer_.
                          super_writer_base<pstore::serialize::archive::details::vector_writer_policy>
                        );
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_1d0,"bytes_.size ()","writer_.bytes_consumed ()",&local_1d8,
             &local_1e0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
  if (!bVar2) {
    testing::Message::Message(&local_1e8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_standard_types.cpp"
               ,0x60,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_1e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
  local_208 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        (&(this->super_StringWriter).bytes_);
  local_210 = pstore::serialize::archive::
              writer_base<pstore::serialize::archive::details::vector_writer_policy>::bytes_produced
                        (&(this->super_StringWriter).writer_.
                          super_writer_base<pstore::serialize::archive::details::vector_writer_policy>
                        );
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_200,"bytes_.size ()","writer_.bytes_produced ()",&local_208,
             &local_210);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_200);
  if (!bVar2) {
    testing::Message::Message(&local_218);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_200);
    testing::internal::AssertHelper::AssertHelper
              (&local_220,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_standard_types.cpp"
               ,0x61,pcVar4);
    testing::internal::AssertHelper::operator=(&local_220,&local_218);
    testing::internal::AssertHelper::~AssertHelper(&local_220);
    testing::Message::~Message(&local_218);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_200);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_168);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_138);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

TEST_F (StringWriter, WriteThreeByteLengthCharString) {
    auto const src_length = three_byte_varint;
    auto const src_char = 'a';
    std::string const str (src_length, src_char);

    pstore::serialize::write (writer_, str);

    EXPECT_EQ (str.length () + 3, bytes_.size ());
    auto first = std::begin (bytes_);
    EXPECT_EQ (0b00000100, *(first++));
    EXPECT_EQ (0b00000000, *(first++));
    EXPECT_EQ (0b00000010, *(first++));
    std::vector<std::uint8_t> const body (first, std::end (bytes_));
    std::vector<std::uint8_t> const expected_body (src_length, src_char);

    EXPECT_THAT (body, ::testing::ContainerEq (expected_body));
    EXPECT_EQ (bytes_.size (), writer_.bytes_consumed ());
    EXPECT_EQ (bytes_.size (), writer_.bytes_produced ());
}